

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O3

int GetBBUserSeanet(SEANET *pSeanet)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  char *__s;
  int iVar7;
  uchar reqbuf [14];
  CHRONO chrono;
  uchar databuf [264];
  int local_1a4;
  undefined6 uStack_1a0;
  undefined2 local_19a;
  undefined6 uStack_198;
  timespec local_190;
  timespec local_180;
  undefined8 local_170;
  undefined8 uStack_168;
  long local_160;
  long lStack_158;
  timespec local_150;
  int local_140;
  uchar local_138 [19];
  char local_125;
  byte local_124;
  char local_d5;
  char local_a6;
  
  uStack_198 = 0xa0280180302;
  uStack_1a0 = 0x83830303040;
  local_19a = 0xff00;
  iVar1 = (pSeanet->RS232Port).DevType;
  iVar7 = 1;
  __s = "Error writing data to a Seanet. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pSeanet->RS232Port).s;
    uVar6 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&uStack_1a0 + uVar6),(ulong)(0xe - (int)uVar6),0);
      if ((int)sVar2 < 1) goto LAB_001a16f2;
      uVar5 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < 0xe);
  }
  else {
    if (iVar1 != 0) goto LAB_001a16f2;
    iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&uStack_1a0 + uVar6),(ulong)(0xe - (int)uVar6));
      if ((int)sVar2 < 1) goto LAB_001a16f2;
      uVar5 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar5;
    } while (uVar5 < 0xe);
  }
  memset(local_138,0,0x108);
  local_1a4 = 0;
  iVar1 = GetMsgSeanet(pSeanet,6,local_138,0x108,&local_1a4);
  if (iVar1 == 0) {
    if (local_125 != '\x0f') {
      pSeanet->bDST = 0;
      pSeanet->bHalfDuplex = (uint)(local_d5 == '\x01');
LAB_001a17d3:
      iVar1 = clock_getres(4,&local_150);
      if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_180), iVar1 == 0)) {
        local_140 = 0;
        local_170 = 0;
        uStack_168 = 0;
        local_160 = 0;
        lStack_158 = 0;
      }
      __s = "Error reading data from a Seanet : BBUser timeout. ";
      while( true ) {
        lVar4 = local_160;
        lVar3 = lStack_158;
        if (local_140 == 0) {
          clock_gettime(4,&local_190);
          lVar4 = ((local_190.tv_sec + local_160) - local_180.tv_sec) +
                  (local_190.tv_nsec + lStack_158) / 1000000000;
          lVar3 = (local_190.tv_nsec + lStack_158) % 1000000000 - local_180.tv_nsec;
          if (lVar3 < 0) {
            lVar4 = lVar4 + ~((ulong)-lVar3 / 1000000000);
            lVar3 = lVar3 + 1000000000 + ((ulong)-lVar3 / 1000000000) * 1000000000;
          }
        }
        if (10.0 < (double)lVar3 / 1000000000.0 + (double)lVar4) break;
        memset(local_138,0,0x108);
        local_1a4 = 0;
        iVar1 = GetLatestMsgSeanet(pSeanet,4,local_138,0x108,&local_1a4);
        if (iVar1 != 0) goto LAB_001a16ef;
        pSeanet->HeadInf = (uint)local_124;
        if (0xbf < local_124) {
          return 0;
        }
      }
      iVar7 = 2;
      goto LAB_001a16f2;
    }
    pSeanet->bDST = 1;
    pSeanet->bHalfDuplex = (uint)(local_a6 == '\x01');
    memset(local_138,0,0x108);
    local_1a4 = 0;
    iVar1 = GetMsgSeanet(pSeanet,0x3f,local_138,0x108,&local_1a4);
    if (iVar1 == 0) {
      memset(local_138,0,0x108);
      local_1a4 = 0;
      iVar1 = GetMsgSeanet(pSeanet,0x39,local_138,0x108,&local_1a4);
      if (iVar1 == 0) goto LAB_001a17d3;
    }
  }
LAB_001a16ef:
  __s = "A Seanet is not responding correctly. ";
LAB_001a16f2:
  puts(__s);
  return iVar7;
}

Assistant:

inline int GetBBUserSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtSendBBUser,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[264];
	int nbdatabytes = 0;
	CHRONO chrono;

	// Send mtSendBBUser message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	// Wait for a mtBBUserData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	//if (GetLatestMsgSeanet(pSeanet, mtBBUserData, databuf, sizeof(databuf), &nbdatabytes)
	//	!= EXIT_SUCCESS)
	if (GetMsgSeanet(pSeanet, mtBBUserData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	if (databuf[19] == 15) 
	{
		pSeanet->bDST = TRUE;
		if (databuf[146] == 1) pSeanet->bHalfDuplex = TRUE; else pSeanet->bHalfDuplex = FALSE;

		// There is a risk here that mtFpgaCalibrationData and mtFpgaVersionData go as unexpected data 
		// for the mtBBUserData if the computer is too slow...
		// Should just wait for mtAlive message (instead of mtFpgaCalibrationData and mtFpgaVersionData) 
		// to be sure? Or should use GetMsgSeanet()?

		// mtFpgaCalibrationData and mtFpgaVersionData messages should follow the mtBBuserData reply.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgSeanet(pSeanet, mtFpgaCalibrationData, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgSeanet(pSeanet, mtFpgaCalibrationData, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgSeanet(pSeanet, mtFpgaVersionData, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgSeanet(pSeanet, mtFpgaVersionData, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}
	}
	else
	{
		pSeanet->bDST = FALSE;
		if (databuf[99] == 1) pSeanet->bHalfDuplex = TRUE; else pSeanet->bHalfDuplex = FALSE;
	}

	StartChrono(&chrono);

	// Check mtAlive message HeadInf byte with NoParams (bit 6=1), SentCfg (bit 7=1).
	do
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_BBUSER_SEANET)
		{
			printf("Error reading data from a Seanet : BBUser timeout. \n");
			return EXIT_TIMEOUT;
		}

		// Wait for a mtAlive message. It should come every 1 second.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// HeadInf.
		pSeanet->HeadInf = (unsigned char)databuf[20];

		//printf("mtAlive message databuf[20]=%#x\n", (int)databuf[20]);
	}
	while (!(databuf[20]&0x40)||!(databuf[20]&0x80));

	return EXIT_SUCCESS;
}